

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O0

PermilleMatcher * __thiscall
icu_63::numparse::impl::PermilleMatcher::operator=(PermilleMatcher *this,PermilleMatcher *param_1)

{
  PermilleMatcher *param_1_local;
  PermilleMatcher *this_local;
  
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  return this;
}

Assistant:

class U_I18N_API PermilleMatcher : public SymbolMatcher {
  public:
    PermilleMatcher() = default;  // WARNING: Leaves the object in an unusable state

    PermilleMatcher(const DecimalFormatSymbols& dfs);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;
}